

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O1

int __thiscall
hbm::streaming::StreamClient::processStreamMetaInformation
          (StreamClient *this,string *method,Value *params)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  ostream *poVar5;
  Value *pVVar6;
  Value *pVVar7;
  const_iterator cVar8;
  undefined1 local_70 [16];
  _Rb_tree_node_base local_60;
  ValueIteratorBase local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)method);
  if (iVar3 == 0) {
    pVVar4 = Json::Value::operator[](params,"streamId");
    Json::Value::asString_abi_cxx11_((string *)local_70,pVVar4);
    std::__cxx11::string::operator=((string *)&this->m_streamId,(string *)local_70);
    if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
      operator_delete((void *)local_70._0_8_);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->m_address)._M_dataplus._M_p,
                        (this->m_address)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": this is ",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->m_streamId)._M_dataplus._M_p,
                        (this->m_streamId)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->m_address)._M_dataplus._M_p,
                        (this->m_address)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": supported features: ",0x16);
    pVVar4 = Json::Value::operator[](params,"supported");
    poVar5 = Json::operator<<(poVar5,pVVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pVVar4 = Json::Value::operator[](params,"commandInterfaces");
    cVar8 = Json::Value::begin(pVVar4);
    local_40.current_ = cVar8.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar8.super_ValueIteratorBase.isNull_;
    local_60._M_right = (_Base_ptr)&this->m_httpPath;
    local_60._M_left = (_Base_ptr)&this->m_controlPort;
    while( true ) {
      cVar8 = Json::Value::end(pVVar4);
      local_70._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
      local_70[8] = cVar8.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_70);
      if (bVar2) break;
      pVVar6 = Json::ValueIteratorBase::deref(&local_40);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->m_address)._M_dataplus._M_p,
                          (this->m_address)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": command interfaces: ",0x16);
      poVar5 = Json::operator<<(poVar5,pVVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pVVar7 = Json::Value::operator[](pVVar6,"httpMethod");
      Json::Value::asString_abi_cxx11_((string *)local_70,pVVar7);
      uVar1 = local_70._0_8_;
      iVar3 = strncasecmp((char *)local_70._0_8_,"post",5);
      if ((_Rb_tree_node_base *)uVar1 != &local_60) {
        operator_delete((void *)uVar1);
      }
      if (iVar3 == 0) {
        pVVar7 = Json::Value::operator[](pVVar6,"httpPath");
        Json::Value::asString_abi_cxx11_((string *)local_70,pVVar7);
        std::__cxx11::string::operator=((string *)local_60._M_right,(string *)local_70);
        if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
          operator_delete((void *)local_70._0_8_);
        }
      }
      if ((this->m_controlPort)._M_string_length == 0) {
        pVVar6 = Json::Value::operator[](pVVar6,"port");
        Json::Value::asString_abi_cxx11_((string *)local_70,pVVar6);
        std::__cxx11::string::operator=((string *)local_60._M_left,(string *)local_70);
        if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
          operator_delete((void *)local_70._0_8_);
        }
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)method);
    if (iVar3 == 0) {
      pVVar4 = Json::Value::operator[](params,"stamp");
      timeInfo::set(&this->m_initialTime,pVVar4);
      pVVar4 = Json::Value::operator[](params,"epoch");
      Json::Value::asString_abi_cxx11_((string *)local_70,pVVar4);
      std::__cxx11::string::operator=((string *)&this->m_initialTimeEpoch,(string *)local_70);
      if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_);
      }
      pVVar4 = Json::Value::operator[](params,"scale");
      Json::Value::asString_abi_cxx11_((string *)local_70,pVVar4);
      std::__cxx11::string::operator=((string *)&this->m_initialTimeScale,(string *)local_70);
      if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_);
      }
    }
  }
  if ((this->m_streamMetaCb).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_streamMetaCb)._M_invoker)((_Any_data *)&this->m_streamMetaCb,this,method,params);
  }
  return 0;
}

Assistant:

int StreamClient::processStreamMetaInformation(const std::string& method, const Json::Value& params)
		{
			try {
				// stream related meta information
				if (method == "init") {
					// this gives important information needed to control the daq stream.
					m_streamId = params["streamId"].asString();
					std::cout << m_address << ": this is " << m_streamId << std::endl;
					std::cout << m_address << ": supported features: " << params["supported"] << std::endl;
					const Json::Value& commandInterfaces = params["commandInterfaces"];
					for (Json::ValueConstIterator iter = commandInterfaces.begin(); iter!= commandInterfaces.end(); ++iter) {
						const Json::Value& element = *iter;
						std::cout << m_address << ": command interfaces: " << element << std::endl;
						static const char POST[] = "post";
						if (strncasecmp(element["httpMethod"].asString().c_str(), POST, sizeof(POST)) == 0) {
							m_httpPath = element["httpPath"].asString();
						}
						
						// do not overwrite if control port is already set.
						// important for devices behind NAT router
						if (m_controlPort.empty()) {
							m_controlPort = element["port"].asString();
						}
					}
				} else if (method == "time") {
					m_initialTime.set(params["stamp"]);
					m_initialTimeEpoch = params["epoch"].asString();
					m_initialTimeScale = params["scale"].asString();
				}
				if(m_streamMetaCb) {
					m_streamMetaCb(*this, method, params);
				}

				return 0;
			} catch(const std::runtime_error& e) {
				std::cerr << e.what();
				return -1;
			}
		}